

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O1

void P_LineOpening_XFloors
               (FLineOpening *open,AActor *thing,line_t *linedef,double x,double y,bool restrict)

{
  sector_t *psVar1;
  xfloor *pxVar2;
  F3DFloor *pFVar3;
  double *pdVar4;
  secplane_t *psVar5;
  int iVar6;
  sector_t *psVar7;
  long lVar8;
  sector_t **ppsVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double lowestfloor [2];
  secplane_t *highestfloorplanes [2];
  xfloor *xf [2];
  int local_d4;
  int local_d0;
  double local_c8 [3];
  sector_t *local_b0;
  double *local_a8 [3];
  FLineOpening *local_90;
  sector_t **local_88;
  sector_t **local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  xfloor *local_48 [3];
  
  if (thing != (AActor *)0x0) {
    dVar16 = (thing->__Pos).Z;
    dVar17 = thing->Height + dVar16;
    psVar7 = linedef->frontsector;
    local_48[0] = &psVar7->e->XFloor;
    psVar1 = linedef->backsector;
    local_48[1] = &psVar1->e->XFloor;
    if (((psVar7->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) ||
       ((psVar1->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0)) {
      local_88 = &linedef->frontsector;
      local_50 = open->top;
      local_90 = open;
      dVar15 = open->bottom;
      local_c8[0] = ((psVar7->floorplane).normal.Y * y +
                    (psVar7->floorplane).normal.X * x + (psVar7->floorplane).D) *
                    (psVar7->floorplane).negiC;
      local_80 = &linedef->backsector;
      local_c8[1] = ((psVar1->floorplane).normal.Y * y +
                    (psVar1->floorplane).normal.X * x + (psVar1->floorplane).D) *
                    (psVar1->floorplane).negiC;
      local_a8[0] = (double *)0x0;
      local_a8[1] = (double *)0x0;
      iVar6 = -1;
      local_b0 = (sector_t *)0x0;
      psVar7 = (sector_t *)0x0;
      local_d0 = -1;
      local_d4 = -1;
      local_60 = y;
      local_68 = x;
      local_70 = dVar16;
      local_78 = dVar17;
      lVar8 = 0;
      do {
        pxVar2 = local_48[lVar8];
        if ((pxVar2->ffloors).super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0) {
          ppsVar9 = local_80;
          if (lVar8 == 0) {
            ppsVar9 = local_88;
          }
          uVar10 = 0;
          do {
            pFVar3 = (pxVar2->ffloors).super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar10];
            if ((~pFVar3->flags & 3) == 0) {
              pdVar4 = (double *)(pFVar3->bottom).plane;
              psVar5 = (pFVar3->top).plane;
              dVar14 = (pdVar4[1] * y + *pdVar4 * x + pdVar4[3]) * pdVar4[4];
              local_58 = (*(double *)((long)&psVar5->normal + 8) * y +
                         (psVar5->normal).X * x + psVar5->D) * psVar5->negiC;
              dVar13 = (dVar14 + local_58) * 0.5;
              dVar12 = ABS(dVar16 - dVar13);
              dVar13 = ABS(dVar17 - dVar13);
              if ((dVar14 < local_50) && (dVar13 < dVar12)) {
                local_d0 = ((pFVar3->bottom).texture)->texnum;
                local_b0 = *ppsVar9;
                local_50 = dVar14;
              }
              if (((dVar15 < local_58) && (dVar12 <= dVar13)) &&
                 ((!restrict || (local_58 <= (thing->__Pos).Z)))) {
                local_d4 = ((pFVar3->top).texture)->texnum;
                iVar6 = sector_t::GetTerrain(pFVar3->model,(pFVar3->top).isceiling);
                y = local_60;
                x = local_68;
                dVar16 = local_70;
                dVar17 = local_78;
                psVar7 = *ppsVar9;
                local_a8[lVar8] = (double *)(pFVar3->top).plane;
                dVar15 = local_58;
              }
              if ((local_c8[lVar8] <= local_58 && local_58 != local_c8[lVar8]) &&
                 (local_58 <= (thing->__Pos).Z + thing->MaxStepHeight)) {
                local_c8[lVar8] = local_58;
              }
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < (pxVar2->ffloors).super_TArray<F3DFloor_*,_F3DFloor_*>.Count);
        }
        bVar11 = lVar8 == 0;
        lVar8 = lVar8 + 1;
      } while (bVar11);
      if (local_90->bottom <= dVar15 && dVar15 != local_90->bottom) {
        local_90->bottom = dVar15;
        (local_90->floorpic).texnum = local_d4;
        local_90->floorterrain = iVar6;
        local_90->bottomsec = psVar7;
        if (local_a8[0] != (double *)0x0) {
          dVar16 = local_a8[0][2];
          (local_90->frontfloorplane).normal.Z = dVar16;
          dVar17 = local_a8[0][1];
          (local_90->frontfloorplane).normal.Y = dVar17;
          dVar15 = *local_a8[0];
          (local_90->frontfloorplane).normal.X = dVar15;
          dVar12 = local_a8[0][4];
          (local_90->frontfloorplane).D = local_a8[0][3];
          (local_90->frontfloorplane).negiC = dVar12;
          if (dVar16 < 0.0) {
            dVar12 = (local_90->frontfloorplane).D;
            (local_90->frontfloorplane).normal.Z = -dVar16;
            (local_90->frontfloorplane).D = -dVar12;
            (local_90->frontfloorplane).normal.X = -dVar15;
            (local_90->frontfloorplane).normal.Y = -dVar17;
            (local_90->frontfloorplane).negiC = -(local_90->frontfloorplane).negiC;
          }
        }
        if (local_a8[1] != (double *)0x0) {
          dVar16 = local_a8[1][2];
          (local_90->backfloorplane).normal.Z = dVar16;
          dVar17 = local_a8[1][1];
          (local_90->backfloorplane).normal.Y = dVar17;
          dVar15 = *local_a8[1];
          (local_90->backfloorplane).normal.X = dVar15;
          dVar12 = local_a8[1][4];
          (local_90->backfloorplane).D = local_a8[1][3];
          (local_90->backfloorplane).negiC = dVar12;
          if (dVar16 < 0.0) {
            dVar12 = (local_90->backfloorplane).D;
            (local_90->backfloorplane).normal.Z = -dVar16;
            (local_90->backfloorplane).D = -dVar12;
            (local_90->backfloorplane).normal.X = -dVar15;
            (local_90->backfloorplane).normal.Y = -dVar17;
            (local_90->backfloorplane).negiC = -(local_90->backfloorplane).negiC;
          }
        }
      }
      if (local_50 < local_90->top) {
        local_90->top = local_50;
        (local_90->ceilingpic).texnum = local_d0;
        local_90->topsec = local_b0;
      }
      if (local_c8[1] <= local_c8[0]) {
        local_c8[0] = local_c8[1];
      }
      local_90->lowfloor = local_c8[0];
    }
  }
  return;
}

Assistant:

void P_LineOpening_XFloors (FLineOpening &open, AActor * thing, const line_t *linedef, 
	double x, double y, bool restrict)
{
    if(thing)
    {
		double thingbot, thingtop;
		
		thingbot = thing->Z();
		thingtop = thing->Top();
		

		extsector_t::xfloor *xf[2] = {&linedef->frontsector->e->XFloor, &linedef->backsector->e->XFloor};

		// Check for 3D-floors in the sector (mostly identical to what Legacy does here)
		if(xf[0]->ffloors.Size() || xf[1]->ffloors.Size())
		{
			double    lowestceiling = open.top;
			double    highestfloor = open.bottom;
			double    lowestfloor[2] = {
				linedef->frontsector->floorplane.ZatPoint(x, y), 
				linedef->backsector->floorplane.ZatPoint(x, y) };
			FTextureID highestfloorpic;
			int highestfloorterrain = -1;
			FTextureID lowestceilingpic;
			sector_t *lowestceilingsec = NULL, *highestfloorsec = NULL;
			secplane_t *highestfloorplanes[2] = { NULL, NULL };
			
			highestfloorpic.SetInvalid();
			lowestceilingpic.SetInvalid();
			
			for(int j=0;j<2;j++)
			{
				for(unsigned i=0;i<xf[j]->ffloors.Size();i++)
				{
					F3DFloor *rover = xf[j]->ffloors[i];

					if (!(rover->flags & FF_EXISTS)) continue;
					if (!(rover->flags & FF_SOLID)) continue;
					
					double ff_bottom=rover->bottom.plane->ZatPoint(x, y);
					double ff_top=rover->top.plane->ZatPoint(x, y);
					
					double delta1 = fabs(thingbot - ((ff_bottom + ff_top) / 2));
					double delta2 = fabs(thingtop - ((ff_bottom + ff_top) / 2));
					
					if(ff_bottom < lowestceiling && delta1 > delta2) 
					{
						lowestceiling = ff_bottom;
						lowestceilingpic = *rover->bottom.texture;
						lowestceilingsec = j == 0 ? linedef->frontsector : linedef->backsector;
					}
					
					if(ff_top > highestfloor && delta1 <= delta2 && (!restrict || thing->Z() >= ff_top))
					{
						highestfloor = ff_top;
						highestfloorpic = *rover->top.texture;
						highestfloorterrain = rover->model->GetTerrain(rover->top.isceiling);
						highestfloorsec = j == 0 ? linedef->frontsector : linedef->backsector;
						highestfloorplanes[j] = rover->top.plane;
					}
					if(ff_top > lowestfloor[j] && ff_top <= thing->Z() + thing->MaxStepHeight) lowestfloor[j] = ff_top;
				}
			}
			
			if(highestfloor > open.bottom)
			{
				open.bottom = highestfloor;
				open.floorpic = highestfloorpic;
				open.floorterrain = highestfloorterrain;
				open.bottomsec = highestfloorsec;
				if (highestfloorplanes[0])
				{
					open.frontfloorplane = *highestfloorplanes[0];
					if (open.frontfloorplane.fC() < 0) open.frontfloorplane.FlipVert();
				}
				if (highestfloorplanes[1])
				{
					open.backfloorplane = *highestfloorplanes[1];
					if (open.backfloorplane.fC() < 0) open.backfloorplane.FlipVert();
				}
			}
			
			if(lowestceiling < open.top) 
			{
				open.top = lowestceiling;
				open.ceilingpic = lowestceilingpic;
				open.topsec = lowestceilingsec;
			}
			
			open.lowfloor = MIN(lowestfloor[0], lowestfloor[1]);
		}
    }
}